

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_casts.cpp
# Opt level: O3

string_t duckdb::HugeintCastToVarInt::Operation<duckdb::hugeint_t>
                   (hugeint_t int_value,Vector *result)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  byte bVar10;
  bool bVar11;
  ulong uVar12;
  Vector *in_RCX;
  long lVar13;
  Vector *extraout_RDX;
  Vector *len;
  Vector *extraout_RDX_00;
  uint uVar14;
  ulong uVar15;
  char *pcVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  double dVar20;
  ulong uVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar47;
  undefined1 auVar45 [16];
  int iVar48;
  undefined1 auVar46 [16];
  int iVar49;
  int iVar60;
  int iVar61;
  int iVar62;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  int iVar72;
  long lVar73;
  long lVar81;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  long lVar82;
  long lVar83;
  uhugeint_t int_value_00;
  string_t blob;
  undefined1 local_88 [16];
  hugeint_t local_78;
  undefined1 local_68 [16];
  long local_58;
  long lStack_50;
  hugeint_t local_40;
  
  len = result;
  local_78 = int_value;
  if (int_value.upper < 0) {
    local_40.lower = 0;
    local_40.upper = -0x8000000000000000;
    bVar11 = hugeint_t::operator==(&local_78,&local_40);
    if (bVar11) {
      int_value_00.upper = (uint64_t)result;
      int_value_00.lower = 0x8000000000000000;
      local_88 = (undefined1  [16])
                 Operation<duckdb::uhugeint_t>((HugeintCastToVarInt *)0x0,int_value_00,in_RCX);
      pcVar16 = local_88._8_8_;
      if (local_88._0_4_ < 0xd) {
        pcVar16 = local_88 + 4;
      }
      Varint::SetHeader(pcVar16,(ulong)local_88._0_4_ - 3,true);
      if (3 < (uint)local_88._0_4_) {
        uVar15 = 3;
        do {
          pcVar16[uVar15] = ~pcVar16[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar15 < (uint)local_88._0_4_);
        if (0xc < (uint)local_88._0_4_) goto LAB_012c6a51;
      }
      uVar15 = (ulong)(uint)local_88._0_4_;
      pcVar16 = local_88 + 4 + uVar15;
      goto LAB_012c6a48;
    }
    local_78 = hugeint_t::operator-(&local_78);
    len = (Vector *)local_78.upper;
    if (len != (Vector *)0xffffffffffffffff) goto LAB_012c60d6;
    uVar17 = 0xffffffffffffffff;
    uVar15 = 8;
LAB_012c6123:
    iVar18 = (int)uVar15 + 8;
  }
  else {
LAB_012c60d6:
    uVar17 = local_78.upper;
    if (uVar17 != 0) {
      lVar73 = uVar17 + 1;
      auVar42._8_4_ = (int)((ulong)lVar73 >> 0x20);
      auVar42._0_8_ = lVar73;
      auVar42._12_4_ = 0x45300000;
      dVar20 = log2((auVar42._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar73) - 4503599627370496.0));
      dVar20 = ceil(dVar20 * 0.125);
      uVar15 = (ulong)dVar20;
      len = extraout_RDX;
      if ((int)uVar15 != 0) goto LAB_012c6123;
    }
    uVar15 = 0;
    if (local_78.lower == 0xffffffffffffffff) {
      iVar18 = 8;
    }
    else {
      lVar73 = local_78.lower + 1;
      auVar45._8_4_ = (int)((ulong)lVar73 >> 0x20);
      auVar45._0_8_ = lVar73;
      auVar45._12_4_ = 0x45300000;
      dVar20 = log2((auVar45._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar73) - 4503599627370496.0));
      dVar20 = ceil(dVar20 * 0.125);
      iVar18 = (int)(long)dVar20;
      len = extraout_RDX_00;
    }
  }
  uVar19 = iVar18 + (uint)(iVar18 == 0);
  local_88 = (undefined1  [16])
             StringVector::EmptyString
                       ((StringVector *)result,(Vector *)(ulong)(uVar19 + 3),(idx_t)len);
  pcVar16 = local_88._8_8_;
  if (local_88._0_4_ < 0xd) {
    pcVar16 = local_88 + 4;
  }
  Varint::SetHeader(pcVar16,(ulong)uVar19,(bool)(int_value.upper._7_1_ >> 7));
  uVar14 = (uint)uVar15;
  bVar10 = (char)int_value.upper._7_1_ >> 7;
  if ((int)uVar14 < 1) {
    uVar12 = 3;
  }
  else {
    uVar12 = (ulong)(uVar14 + 3);
    lVar13 = (uVar15 & 0xffffffff) - 1;
    uVar21 = uVar15 & 0xffffffff;
    lVar73 = uVar21 - 0xe;
    uVar15 = uVar15 & 0xffffffff;
    lVar81 = uVar15 - 0xf;
    lVar32 = uVar21 - 0xc;
    lVar33 = uVar15 - 0xd;
    lVar34 = uVar21 - 10;
    lVar35 = uVar15 - 0xb;
    lVar36 = uVar21 - 8;
    lVar37 = uVar15 - 9;
    lVar38 = uVar21 - 6;
    lVar39 = uVar15 - 7;
    lVar40 = uVar21 - 4;
    lVar41 = uVar15 - 5;
    lVar82 = uVar21 - 2;
    lVar83 = uVar15 - 3;
    lVar22 = uVar15 - 1;
    local_68._8_4_ = (int)lVar13;
    local_68._0_8_ = lVar13;
    local_68._12_4_ = (int)((ulong)lVar13 >> 0x20);
    uVar15 = 0;
    do {
      auVar71._8_4_ = (int)uVar15;
      auVar71._0_8_ = uVar15;
      auVar71._12_4_ = (int)(uVar15 >> 0x20);
      auVar45 = local_68 ^ _DAT_01d84390;
      auVar42 = (auVar71 | _DAT_01d84380) ^ _DAT_01d84390;
      iVar18 = auVar45._0_4_;
      iVar49 = -(uint)(iVar18 < auVar42._0_4_);
      iVar72 = auVar45._4_4_;
      iVar60 = -(uint)(iVar72 < auVar42._4_4_);
      iVar47 = auVar45._8_4_;
      iVar61 = -(uint)(iVar47 < auVar42._8_4_);
      iVar48 = auVar45._12_4_;
      iVar62 = -(uint)(iVar48 < auVar42._12_4_);
      auVar74._4_4_ = iVar49;
      auVar74._0_4_ = iVar49;
      auVar74._8_4_ = iVar61;
      auVar74._12_4_ = iVar61;
      auVar67 = pshuflw(in_XMM12,auVar74,0xe8);
      auVar43._4_4_ = -(uint)(auVar42._4_4_ == iVar72);
      auVar43._12_4_ = -(uint)(auVar42._12_4_ == iVar48);
      auVar43._0_4_ = auVar43._4_4_;
      auVar43._8_4_ = auVar43._12_4_;
      auVar45 = pshuflw(in_XMM10,auVar43,0xe8);
      auVar44._4_4_ = iVar60;
      auVar44._0_4_ = iVar60;
      auVar44._8_4_ = iVar62;
      auVar44._12_4_ = iVar62;
      auVar42 = pshuflw(_DAT_01d84390,auVar44,0xe8);
      auVar23._8_4_ = 0xffffffff;
      auVar23._0_8_ = 0xffffffffffffffff;
      auVar23._12_4_ = 0xffffffff;
      auVar23 = (auVar42 | auVar45 & auVar67) ^ auVar23;
      auVar42 = packssdw(auVar23,auVar23);
      local_58 = lVar73;
      lStack_50 = lVar81;
      if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar16[uVar15 + 3] = (byte)(uVar17 >> (((char)uVar21 + -1) * '\b' & 0x3fU)) ^ bVar10;
      }
      auVar44 = auVar43 & auVar74 | auVar44;
      auVar42 = packssdw(auVar44,auVar44);
      auVar67._8_4_ = 0xffffffff;
      auVar67._0_8_ = 0xffffffffffffffff;
      auVar67._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar67,auVar42 ^ auVar67);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._0_4_ >> 8 & 1) != 0) {
        pcVar16[uVar15 + 4] = (byte)(uVar17 >> ((byte)((int)(lVar22 + -1) << 3) & 0x3f)) ^ bVar10;
      }
      auVar42 = (auVar71 | _DAT_01db3e50) ^ _DAT_01d84390;
      iVar49 = -(uint)(iVar18 < auVar42._0_4_);
      iVar61 = -(uint)(iVar72 < auVar42._4_4_);
      iVar60 = -(uint)(iVar47 < auVar42._8_4_);
      iVar62 = -(uint)(iVar48 < auVar42._12_4_);
      auVar50._4_4_ = iVar49;
      auVar50._0_4_ = iVar49;
      auVar50._8_4_ = iVar60;
      auVar50._12_4_ = iVar60;
      iVar49 = -(uint)(auVar42._4_4_ == iVar72);
      iVar60 = -(uint)(auVar42._12_4_ == iVar48);
      auVar75._4_4_ = iVar49;
      auVar75._0_4_ = iVar49;
      auVar75._8_4_ = iVar60;
      auVar75._12_4_ = iVar60;
      auVar68._4_4_ = iVar61;
      auVar68._0_4_ = iVar61;
      auVar68._8_4_ = iVar62;
      auVar68._12_4_ = iVar62;
      auVar42 = auVar75 & auVar50 | auVar68;
      auVar42 = packssdw(auVar42,auVar42);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar1,auVar42 ^ auVar1);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._0_4_ >> 0x10 & 1) != 0) {
        pcVar16[uVar15 + 5] = (byte)(uVar17 >> (((char)lVar82 + -1) * '\b' & 0x3fU)) ^ bVar10;
      }
      auVar42 = pshufhw(auVar42,auVar50,0x84);
      auVar23 = pshufhw(auVar50,auVar75,0x84);
      auVar45 = pshufhw(auVar42,auVar68,0x84);
      auVar24._8_4_ = 0xffffffff;
      auVar24._0_8_ = 0xffffffffffffffff;
      auVar24._12_4_ = 0xffffffff;
      auVar24 = (auVar45 | auVar23 & auVar42) ^ auVar24;
      auVar42 = packssdw(auVar24,auVar24);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._0_4_ >> 0x18 & 1) != 0) {
        pcVar16[uVar15 + 6] = (byte)(uVar17 >> ((byte)((int)(lVar83 + -1) << 3) & 0x3f)) ^ bVar10;
      }
      auVar42 = (auVar71 | _DAT_01db3e80) ^ _DAT_01d84390;
      auVar63._0_4_ = -(uint)(iVar18 < auVar42._0_4_);
      auVar63._4_4_ = -(uint)(iVar72 < auVar42._4_4_);
      auVar63._8_4_ = -(uint)(iVar47 < auVar42._8_4_);
      auVar63._12_4_ = -(uint)(iVar48 < auVar42._12_4_);
      auVar76._4_4_ = auVar63._0_4_;
      auVar76._0_4_ = auVar63._0_4_;
      auVar76._8_4_ = auVar63._8_4_;
      auVar76._12_4_ = auVar63._8_4_;
      auVar23 = pshuflw(auVar68,auVar76,0xe8);
      auVar25._0_4_ = -(uint)(auVar42._0_4_ == iVar18);
      auVar25._4_4_ = -(uint)(auVar42._4_4_ == iVar72);
      auVar25._8_4_ = -(uint)(auVar42._8_4_ == iVar47);
      auVar25._12_4_ = -(uint)(auVar42._12_4_ == iVar48);
      auVar51._4_4_ = auVar25._4_4_;
      auVar51._0_4_ = auVar25._4_4_;
      auVar51._8_4_ = auVar25._12_4_;
      auVar51._12_4_ = auVar25._12_4_;
      auVar42 = pshuflw(auVar25,auVar51,0xe8);
      auVar52._4_4_ = auVar63._4_4_;
      auVar52._0_4_ = auVar63._4_4_;
      auVar52._8_4_ = auVar63._12_4_;
      auVar52._12_4_ = auVar63._12_4_;
      auVar45 = pshuflw(auVar63,auVar52,0xe8);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 & auVar23,(auVar45 | auVar42 & auVar23) ^ auVar2);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pcVar16[uVar15 + 7] = (byte)(uVar17 >> (((char)lVar40 + -1) * '\b' & 0x3fU)) ^ bVar10;
      }
      auVar52 = auVar51 & auVar76 | auVar52;
      auVar45 = packssdw(auVar52,auVar52);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42,auVar45 ^ auVar3);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._4_2_ >> 8 & 1) != 0) {
        pcVar16[uVar15 + 8] = (byte)(uVar17 >> ((byte)((int)(lVar41 + -1) << 3) & 0x3f)) ^ bVar10;
      }
      auVar42 = (auVar71 | _DAT_01db3e70) ^ _DAT_01d84390;
      iVar49 = -(uint)(iVar18 < auVar42._0_4_);
      iVar61 = -(uint)(iVar72 < auVar42._4_4_);
      iVar60 = -(uint)(iVar47 < auVar42._8_4_);
      iVar62 = -(uint)(iVar48 < auVar42._12_4_);
      auVar53._4_4_ = iVar49;
      auVar53._0_4_ = iVar49;
      auVar53._8_4_ = iVar60;
      auVar53._12_4_ = iVar60;
      iVar49 = -(uint)(auVar42._4_4_ == iVar72);
      iVar60 = -(uint)(auVar42._12_4_ == iVar48);
      auVar69._4_4_ = iVar49;
      auVar69._0_4_ = iVar49;
      auVar69._8_4_ = iVar60;
      auVar69._12_4_ = iVar60;
      auVar77._4_4_ = iVar61;
      auVar77._0_4_ = iVar61;
      auVar77._8_4_ = iVar62;
      auVar77._12_4_ = iVar62;
      auVar42 = auVar69 & auVar53 | auVar77;
      auVar42 = packssdw(auVar42,auVar42);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar4,auVar42 ^ auVar4);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pcVar16[uVar15 + 9] = (byte)(uVar17 >> (((char)lVar38 + -1) * '\b' & 0x3fU)) ^ bVar10;
      }
      auVar42 = pshufhw(auVar42,auVar53,0x84);
      auVar23 = pshufhw(auVar53,auVar69,0x84);
      auVar45 = pshufhw(auVar42,auVar77,0x84);
      auVar26._8_4_ = 0xffffffff;
      auVar26._0_8_ = 0xffffffffffffffff;
      auVar26._12_4_ = 0xffffffff;
      auVar26 = (auVar45 | auVar23 & auVar42) ^ auVar26;
      auVar42 = packssdw(auVar26,auVar26);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._6_2_ >> 8 & 1) != 0) {
        pcVar16[uVar15 + 10] = (byte)(uVar17 >> ((byte)((int)(lVar39 + -1) << 3) & 0x3f)) ^ bVar10;
      }
      auVar42 = (auVar71 | _DAT_01dd4080) ^ _DAT_01d84390;
      auVar64._0_4_ = -(uint)(iVar18 < auVar42._0_4_);
      auVar64._4_4_ = -(uint)(iVar72 < auVar42._4_4_);
      auVar64._8_4_ = -(uint)(iVar47 < auVar42._8_4_);
      auVar64._12_4_ = -(uint)(iVar48 < auVar42._12_4_);
      auVar78._4_4_ = auVar64._0_4_;
      auVar78._0_4_ = auVar64._0_4_;
      auVar78._8_4_ = auVar64._8_4_;
      auVar78._12_4_ = auVar64._8_4_;
      auVar23 = pshuflw(auVar69,auVar78,0xe8);
      auVar27._0_4_ = -(uint)(auVar42._0_4_ == iVar18);
      auVar27._4_4_ = -(uint)(auVar42._4_4_ == iVar72);
      auVar27._8_4_ = -(uint)(auVar42._8_4_ == iVar47);
      auVar27._12_4_ = -(uint)(auVar42._12_4_ == iVar48);
      auVar54._4_4_ = auVar27._4_4_;
      auVar54._0_4_ = auVar27._4_4_;
      auVar54._8_4_ = auVar27._12_4_;
      auVar54._12_4_ = auVar27._12_4_;
      auVar42 = pshuflw(auVar27,auVar54,0xe8);
      auVar55._4_4_ = auVar64._4_4_;
      auVar55._0_4_ = auVar64._4_4_;
      auVar55._8_4_ = auVar64._12_4_;
      auVar55._12_4_ = auVar64._12_4_;
      auVar45 = pshuflw(auVar64,auVar55,0xe8);
      auVar65._8_4_ = 0xffffffff;
      auVar65._0_8_ = 0xffffffffffffffff;
      auVar65._12_4_ = 0xffffffff;
      auVar65 = (auVar45 | auVar42 & auVar23) ^ auVar65;
      auVar45 = packssdw(auVar65,auVar65);
      auVar42 = packsswb(auVar42 & auVar23,auVar45);
      if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar16[uVar15 + 0xb] = (byte)(uVar17 >> (((char)lVar36 + -1) * '\b' & 0x3fU)) ^ bVar10;
      }
      auVar55 = auVar54 & auVar78 | auVar55;
      auVar45 = packssdw(auVar55,auVar55);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar45 = packssdw(auVar45 ^ auVar5,auVar45 ^ auVar5);
      auVar42 = packsswb(auVar42,auVar45);
      if ((auVar42._8_2_ >> 8 & 1) != 0) {
        pcVar16[uVar15 + 0xc] = (byte)(uVar17 >> ((byte)((int)(lVar37 + -1) << 3) & 0x3f)) ^ bVar10;
      }
      auVar42 = (auVar71 | _DAT_01dd4070) ^ _DAT_01d84390;
      iVar49 = -(uint)(iVar18 < auVar42._0_4_);
      iVar61 = -(uint)(iVar72 < auVar42._4_4_);
      iVar60 = -(uint)(iVar47 < auVar42._8_4_);
      iVar62 = -(uint)(iVar48 < auVar42._12_4_);
      auVar56._4_4_ = iVar49;
      auVar56._0_4_ = iVar49;
      auVar56._8_4_ = iVar60;
      auVar56._12_4_ = iVar60;
      iVar49 = -(uint)(auVar42._4_4_ == iVar72);
      iVar60 = -(uint)(auVar42._12_4_ == iVar48);
      auVar70._4_4_ = iVar49;
      auVar70._0_4_ = iVar49;
      auVar70._8_4_ = iVar60;
      auVar70._12_4_ = iVar60;
      auVar79._4_4_ = iVar61;
      auVar79._0_4_ = iVar61;
      auVar79._8_4_ = iVar62;
      auVar79._12_4_ = iVar62;
      auVar42 = auVar70 & auVar56 | auVar79;
      auVar42 = packssdw(auVar42,auVar42);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar6,auVar42 ^ auVar6);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pcVar16[uVar15 + 0xd] = (byte)(uVar17 >> (((char)lVar34 + -1) * '\b' & 0x3fU)) ^ bVar10;
      }
      auVar42 = pshufhw(auVar42,auVar56,0x84);
      auVar23 = pshufhw(auVar56,auVar70,0x84);
      auVar45 = pshufhw(auVar42,auVar79,0x84);
      auVar28._8_4_ = 0xffffffff;
      auVar28._0_8_ = 0xffffffffffffffff;
      auVar28._12_4_ = 0xffffffff;
      auVar28 = (auVar45 | auVar23 & auVar42) ^ auVar28;
      auVar42 = packssdw(auVar28,auVar28);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._10_2_ >> 8 & 1) != 0) {
        pcVar16[uVar15 + 0xe] = (byte)(uVar17 >> ((byte)((int)(lVar35 + -1) << 3) & 0x3f)) ^ bVar10;
      }
      auVar42 = (auVar71 | _DAT_01dd4060) ^ _DAT_01d84390;
      auVar66._0_4_ = -(uint)(iVar18 < auVar42._0_4_);
      auVar66._4_4_ = -(uint)(iVar72 < auVar42._4_4_);
      auVar66._8_4_ = -(uint)(iVar47 < auVar42._8_4_);
      auVar66._12_4_ = -(uint)(iVar48 < auVar42._12_4_);
      auVar80._4_4_ = auVar66._0_4_;
      auVar80._0_4_ = auVar66._0_4_;
      auVar80._8_4_ = auVar66._8_4_;
      auVar80._12_4_ = auVar66._8_4_;
      auVar23 = pshuflw(auVar70,auVar80,0xe8);
      auVar29._0_4_ = -(uint)(auVar42._0_4_ == iVar18);
      auVar29._4_4_ = -(uint)(auVar42._4_4_ == iVar72);
      auVar29._8_4_ = -(uint)(auVar42._8_4_ == iVar47);
      auVar29._12_4_ = -(uint)(auVar42._12_4_ == iVar48);
      auVar57._4_4_ = auVar29._4_4_;
      auVar57._0_4_ = auVar29._4_4_;
      auVar57._8_4_ = auVar29._12_4_;
      auVar57._12_4_ = auVar29._12_4_;
      auVar42 = pshuflw(auVar29,auVar57,0xe8);
      auVar58._4_4_ = auVar66._4_4_;
      auVar58._0_4_ = auVar66._4_4_;
      auVar58._8_4_ = auVar66._12_4_;
      auVar58._12_4_ = auVar66._12_4_;
      auVar45 = pshuflw(auVar66,auVar58,0xe8);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 & auVar23,(auVar45 | auVar42 & auVar23) ^ auVar7);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pcVar16[uVar15 + 0xf] = (byte)(uVar17 >> (((char)lVar32 + -1) * '\b' & 0x3fU)) ^ bVar10;
      }
      auVar58 = auVar57 & auVar80 | auVar58;
      auVar45 = packssdw(auVar58,auVar58);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42,auVar45 ^ auVar8);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._12_2_ >> 8 & 1) != 0) {
        pcVar16[uVar15 + 0x10] = (byte)(uVar17 >> ((byte)((int)(lVar33 + -1) << 3) & 0x3f)) ^ bVar10
        ;
      }
      lVar81 = lStack_50;
      lVar73 = local_58;
      lVar13 = lStack_50 + -1;
      auVar42 = (auVar71 | _DAT_01dd4050) ^ _DAT_01d84390;
      auVar30._0_4_ = -(uint)(iVar18 < auVar42._0_4_);
      auVar30._4_4_ = -(uint)(iVar72 < auVar42._4_4_);
      auVar30._8_4_ = -(uint)(iVar47 < auVar42._8_4_);
      auVar30._12_4_ = -(uint)(iVar48 < auVar42._12_4_);
      auVar59._4_4_ = auVar30._0_4_;
      auVar59._0_4_ = auVar30._0_4_;
      auVar59._8_4_ = auVar30._8_4_;
      auVar59._12_4_ = auVar30._8_4_;
      iVar18 = -(uint)(auVar42._4_4_ == iVar72);
      iVar72 = -(uint)(auVar42._12_4_ == iVar48);
      auVar46._4_4_ = iVar18;
      auVar46._0_4_ = iVar18;
      auVar46._8_4_ = iVar72;
      auVar46._12_4_ = iVar72;
      in_XMM12._4_4_ = auVar30._4_4_;
      in_XMM12._0_4_ = auVar30._4_4_;
      in_XMM12._8_4_ = auVar30._12_4_;
      in_XMM12._12_4_ = auVar30._12_4_;
      in_XMM10 = auVar46 & auVar59 | in_XMM12;
      auVar42 = packssdw(auVar30,in_XMM10);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar9,auVar42 ^ auVar9);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pcVar16[uVar15 + 0x11] = (byte)(uVar17 >> (((char)local_58 + -1) * '\b' & 0x3fU)) ^ bVar10;
      }
      auVar42 = pshufhw(auVar42,auVar59,0x84);
      auVar23 = pshufhw(auVar46,auVar46,0x84);
      auVar45 = pshufhw(auVar42,in_XMM12,0x84);
      auVar31._8_4_ = 0xffffffff;
      auVar31._0_8_ = 0xffffffffffffffff;
      auVar31._12_4_ = 0xffffffff;
      auVar31 = (auVar45 | auVar23 & auVar42) ^ auVar31;
      auVar42 = packssdw(auVar31,auVar31);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._14_2_ >> 8 & 1) != 0) {
        pcVar16[uVar15 + 0x12] = bVar10 ^ (byte)(uVar17 >> ((byte)((int)lVar13 << 3) & 0x3f));
      }
      uVar15 = uVar15 + 0x10;
      uVar21 = uVar21 - 0x10;
      lVar22 = lVar22 + -0x10;
      lVar82 = lVar82 + -0x10;
      lVar83 = lVar83 + -0x10;
      lVar40 = lVar40 + -0x10;
      lVar41 = lVar41 + -0x10;
      lVar38 = lVar38 + -0x10;
      lVar39 = lVar39 + -0x10;
      lVar36 = lVar36 + -0x10;
      lVar37 = lVar37 + -0x10;
      lVar34 = lVar34 + -0x10;
      lVar35 = lVar35 + -0x10;
      lVar32 = lVar32 + -0x10;
      lVar33 = lVar33 + -0x10;
      lVar73 = lVar73 + -0x10;
      lVar81 = lVar81 + -0x10;
    } while ((uVar14 + 0xf & 0xfffffff0) != uVar15);
  }
  if (-1 < (int)(~uVar14 + uVar19)) {
    lVar81 = (ulong)(~uVar14 + uVar19) << 3;
    lVar73 = 0;
    do {
      pcVar16[lVar73 + uVar12] = (byte)(local_78.lower >> ((byte)lVar81 & 0x38)) ^ bVar10;
      lVar81 = lVar81 + -8;
      lVar73 = lVar73 + 1;
    } while (uVar19 - uVar14 != (int)lVar73);
  }
  uVar15 = (ulong)(uint)local_88._0_4_;
  if (0xc < uVar15) {
LAB_012c6a51:
    local_88._4_4_ = *(undefined4 *)local_88._8_8_;
    return (string_t)(anon_union_16_2_67f50693_for_value)local_88;
  }
  pcVar16 = local_88 + 4 + uVar15;
LAB_012c6a48:
  switchD_01043a80::default(pcVar16,0,0xc - uVar15);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_88;
}

Assistant:

string_t HugeintCastToVarInt::Operation(hugeint_t int_value, Vector &result) {
	// Determine if the number is negative
	bool is_negative = int_value.upper >> 63 & 1;
	if (is_negative) {
		// We must check if it's -170141183460469231731687303715884105728, since it's not possible to negate it
		// without overflowing
		if (int_value == NumericLimits<hugeint_t>::Minimum()) {
			uhugeint_t u_int_value {0x8000000000000000, 0};
			auto cast_value = Operation<uhugeint_t>(u_int_value, result);
			// We have to do all the bit flipping.
			auto writable_value_ptr = cast_value.GetDataWriteable();
			Varint::SetHeader(writable_value_ptr, cast_value.GetSize() - Varint::VARINT_HEADER_SIZE, is_negative);
			for (idx_t i = Varint::VARINT_HEADER_SIZE; i < cast_value.GetSize(); i++) {
				writable_value_ptr[i] = static_cast<char>(~writable_value_ptr[i]);
			}
			cast_value.Finalize();
			return cast_value;
		}
		int_value = -int_value;
	}
	// Determine the number of data bytes
	uint64_t abs_value_upper = static_cast<uint64_t>(int_value.upper);

	uint32_t data_byte_size;
	if (abs_value_upper != NumericLimits<uint64_t>::Maximum()) {
		data_byte_size =
		    (abs_value_upper == 0) ? 0 : static_cast<uint32_t>(std::ceil(std::log2(abs_value_upper + 1) / 8.0));
	} else {
		data_byte_size = static_cast<uint32_t>(std::ceil(std::log2(abs_value_upper) / 8.0));
	}

	uint32_t upper_byte_size = data_byte_size;
	if (data_byte_size > 0) {
		// If we have at least one byte on the upper side, the bottom side is complete
		data_byte_size += 8;
	} else {
		if (int_value.lower != NumericLimits<uint64_t>::Maximum()) {
			data_byte_size += static_cast<uint32_t>(std::ceil(std::log2(int_value.lower + 1) / 8.0));
		} else {
			data_byte_size += static_cast<uint32_t>(std::ceil(std::log2(int_value.lower) / 8.0));
		}
	}

	if (data_byte_size == 0) {
		data_byte_size++;
	}
	uint32_t blob_size = data_byte_size + Varint::VARINT_HEADER_SIZE;
	auto blob = StringVector::EmptyString(result, blob_size);
	auto writable_blob = blob.GetDataWriteable();
	Varint::SetHeader(writable_blob, data_byte_size, is_negative);

	// Add data bytes to the blob, starting off after header bytes
	idx_t wb_idx = Varint::VARINT_HEADER_SIZE;
	for (int i = static_cast<int>(upper_byte_size) - 1; i >= 0; --i) {
		if (is_negative) {
			writable_blob[wb_idx++] = static_cast<char>(~(abs_value_upper >> i * 8 & 0xFF));
		} else {
			writable_blob[wb_idx++] = static_cast<char>(abs_value_upper >> i * 8 & 0xFF);
		}
	}
	for (int i = static_cast<int>(data_byte_size - upper_byte_size) - 1; i >= 0; --i) {
		if (is_negative) {
			writable_blob[wb_idx++] = static_cast<char>(~(int_value.lower >> i * 8 & 0xFF));
		} else {
			writable_blob[wb_idx++] = static_cast<char>(int_value.lower >> i * 8 & 0xFF);
		}
	}
	blob.Finalize();
	return blob;
}